

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O0

int Fraig_NodeIsInSupergate(Fraig_Node_t *pOld,Fraig_Node_t *pNew)

{
  int iVar1;
  int iVar2;
  int RetValue2;
  int RetValue1;
  Fraig_Node_t *pNew_local;
  Fraig_Node_t *pOld_local;
  
  if (((ulong)pOld & 0xfffffffffffffffe) == ((ulong)pNew & 0xfffffffffffffffe)) {
    pOld_local._4_4_ = -1;
    if (pOld == pNew) {
      pOld_local._4_4_ = 1;
    }
  }
  else if ((((ulong)pOld & 1) == 0) && (iVar1 = Fraig_NodeIsVar(pOld), iVar1 == 0)) {
    iVar1 = Fraig_NodeIsInSupergate(pOld->p1,pNew);
    iVar2 = Fraig_NodeIsInSupergate(pOld->p2,pNew);
    if ((iVar1 == -1) || (iVar2 == -1)) {
      pOld_local._4_4_ = -1;
    }
    else if ((iVar1 == 1) || (iVar2 == 1)) {
      pOld_local._4_4_ = 1;
    }
    else {
      pOld_local._4_4_ = 0;
    }
  }
  else {
    pOld_local._4_4_ = 0;
  }
  return pOld_local._4_4_;
}

Assistant:

int Fraig_NodeIsInSupergate( Fraig_Node_t * pOld, Fraig_Node_t * pNew )
{
    int RetValue1, RetValue2;
    if ( Fraig_Regular(pOld) == Fraig_Regular(pNew) )
        return (pOld == pNew)? 1 : -1;
    if ( Fraig_IsComplement(pOld) || Fraig_NodeIsVar(pOld) )
        return 0;
    RetValue1 = Fraig_NodeIsInSupergate( pOld->p1, pNew );
    RetValue2 = Fraig_NodeIsInSupergate( pOld->p2, pNew );
    if ( RetValue1 == -1 || RetValue2 == -1 )
        return -1;
    if ( RetValue1 ==  1 || RetValue2 ==  1 )
        return 1;
    return 0;
}